

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O0

void __thiscall
ExternalFixupMembersImport_Addend_Test::TestBody(ExternalFixupMembersImport_Addend_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Message *pMVar3;
  error_code *peVar4;
  reference pvVar5;
  char *in_R9;
  error_code eVar6;
  AssertHelper local_460;
  Message local_458;
  error_code local_450;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_410;
  Message local_408;
  bool local_3f9;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar__1;
  string local_3e0;
  undefined1 local_3c0 [8];
  parser<pstore::exchange::import_ns::callbacks> parser2;
  Message local_310;
  int local_304;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_2;
  Message local_2e8;
  uint local_2dc;
  size_type local_2d8;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_2a0;
  string local_298;
  Message local_278;
  bool local_269;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_;
  allocator local_249;
  string local_248;
  undefined1 local_228 [8];
  parser<pstore::exchange::import_ns::callbacks> parser1;
  external_fixup_collection fixups;
  AssertHelper local_160;
  Message local_158;
  error_code local_150;
  allocator local_139;
  string local_138;
  not_null<transaction_base_*> local_118;
  error_code local_110;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  string_mapping imported_names;
  unique_lock<mock_mutex> local_60;
  undefined1 local_50 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  mock_mutex mutex;
  ExternalFixupMembersImport_Addend_Test *this_local;
  
  std::unique_lock<mock_mutex>::unique_lock(&local_60,(mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_50,
          &(this->super_ExternalFixupMembersImport).db_,&local_60);
  std::unique_lock<mock_mutex>::~unique_lock(&local_60);
  pstore::exchange::import_ns::string_mapping::string_mapping((string_mapping *)&gtest_ar.message_);
  pstore::gsl::not_null<pstore::transaction_base_*>::not_null
            (&local_118,(transaction_base *)local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,"name",&local_139);
  eVar6 = pstore::exchange::import_ns::string_mapping::add_string
                    ((string_mapping *)&gtest_ar.message_,local_118,&local_138);
  local_110._M_cat = eVar6._M_cat;
  local_110._M_value = eVar6._M_value;
  std::error_code::error_code(&local_150);
  testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
            ((EqHelper *)local_100,"imported_names.add_string (&transaction, \"name\")",
             "std::error_code{}",&local_110,&local_150);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
               ,0x24f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  if (bVar1) {
    std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::vector
              ((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                *)&parser1.coordinate_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_248,"{ \"name\":0, \"type\":17, \"offset\":19 }",&local_249);
    pstore::gsl::
    not_null<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>
    ::not_null((not_null<std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>_*>
                *)&gtest_ar_.message_,
               (vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                *)&parser1.coordinate_);
    anon_unknown.dwarf_33b920::ExternalFixupMembersImport::parse
              ((parser<pstore::exchange::import_ns::callbacks> *)local_228,&local_248,
               &(this->super_ExternalFixupMembersImport).db_,(string_mapping *)&gtest_ar.message_,
               (not_null<external_fixup_collection_*>)
               gtest_ar_.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    std::__cxx11::string::~string((string *)&local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    local_269 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                          ((parser<pstore::exchange::import_ns::callbacks> *)local_228);
    local_269 = !local_269;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_268,&local_269,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
    if (!bVar1) {
      testing::Message::Message(&local_278);
      pMVar3 = testing::Message::operator<<(&local_278,(char (*) [17])"JSON error was: ");
      peVar4 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                         ((parser<pstore::exchange::import_ns::callbacks> *)local_228);
      std::error_code::message_abi_cxx11_(&local_298,peVar4);
      pMVar3 = testing::Message::operator<<(pMVar3,&local_298);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_268,
                 (AssertionResult *)"parser1.has_error ()","true","false",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                 ,0x256,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2a0,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_2a0);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      std::__cxx11::string::~string((string *)&local_298);
      testing::Message::~Message(&local_278);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
    local_2d8 = std::
                vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                ::size((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                        *)&parser1.coordinate_);
    local_2dc = 1;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_2d0,"fixups.size ()","1U",&local_2d8,&local_2dc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
    if (!bVar1) {
      testing::Message::Message(&local_2e8);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2d0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                 ,600,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_2e8);
    }
    bVar1 = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
    if (!bVar1) {
      pvVar5 = std::
               vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::
               operator[]((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>
                           *)&parser1.coordinate_,0);
      local_304 = 0;
      testing::internal::EqHelper::Compare<long,_int,_nullptr>
                ((EqHelper *)local_300,"fixups[0].addend","0",&pvVar5->addend,&local_304);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
      if (!bVar1) {
        testing::Message::Message(&local_310);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&parser2.coordinate_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                   ,0x259,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&parser2.coordinate_,&local_310);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&parser2.coordinate_);
        testing::Message::~Message(&local_310);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
      bVar1 = false;
    }
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
              ((parser<pstore::exchange::import_ns::callbacks> *)local_228);
    std::vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_>::
    ~vector((vector<pstore::repo::external_fixup,_std::allocator<pstore::repo::external_fixup>_> *)
            &parser1.coordinate_);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_3e0,"{ \"name\":0, \"type\":17, \"offset\":19, \"addend\":true }",
                 (allocator *)
                 ((long)&gtest_ar__1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 7));
      anon_unknown.dwarf_33b920::ExternalFixupMembersImport::parse
                ((parser<pstore::exchange::import_ns::callbacks> *)local_3c0,&local_3e0,
                 &(this->super_ExternalFixupMembersImport).db_,(string_mapping *)&gtest_ar.message_)
      ;
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&gtest_ar__1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 7));
      local_3f9 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                            ((parser<pstore::exchange::import_ns::callbacks> *)local_3c0);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_3f8,&local_3f9,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
      if (!bVar1) {
        testing::Message::Message(&local_408);
        pMVar3 = testing::Message::operator<<
                           (&local_408,(char (*) [27])"Expected the parse to fail");
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_3.message_,(internal *)local_3f8,
                   (AssertionResult *)"parser2.has_error ()","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_410,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                   ,0x25f,pcVar2);
        testing::internal::AssertHelper::operator=(&local_410,pMVar3);
        testing::internal::AssertHelper::~AssertHelper(&local_410);
        std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_408);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
      peVar4 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                         ((parser<pstore::exchange::import_ns::callbacks> *)local_3c0);
      eVar6 = pstore::exchange::import_ns::make_error_code(unexpected_boolean);
      local_450._M_cat = eVar6._M_cat;
      local_450._M_value = eVar6._M_value;
      testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
                ((EqHelper *)local_440,"parser2.last_error ()",
                 "make_error_code (pstore::exchange::import_ns::error::unexpected_boolean)",peVar4,
                 &local_450);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
      if (!bVar1) {
        testing::Message::Message(&local_458);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
        testing::internal::AssertHelper::AssertHelper
                  (&local_460,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_section_fixups.cpp"
                   ,0x261,pcVar2);
        testing::internal::AssertHelper::operator=(&local_460,&local_458);
        testing::internal::AssertHelper::~AssertHelper(&local_460);
        testing::Message::~Message(&local_458);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
      pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
                ((parser<pstore::exchange::import_ns::callbacks> *)local_3c0);
    }
  }
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)&gtest_ar.message_)
  ;
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_50);
  return;
}

Assistant:

TEST_F (ExternalFixupMembersImport, Addend) {
    mock_mutex mutex;
    auto transaction = begin (db_, transaction_lock{mutex});
    pstore::exchange::import_ns::string_mapping imported_names;
    ASSERT_EQ (imported_names.add_string (&transaction, "name"), std::error_code{});

    // The "addend" key is missing altogether. That's okay: the default is 0.
    {
        external_fixup_collection fixups;
        auto const parser1 =
            this->parse (R"({ "name":0, "type":17, "offset":19 })", &db_, imported_names, &fixups);
        EXPECT_FALSE (parser1.has_error ())
            << "JSON error was: " << parser1.last_error ().message ();
        ASSERT_EQ (fixups.size (), 1U);
        EXPECT_EQ (fixups[0].addend, 0);
    }
    // The "addend" key has the wrong type.
    {
        auto const parser2 = this->parse (R"({ "name":0, "type":17, "offset":19, "addend":true })",
                                          &db_, imported_names);
        EXPECT_TRUE (parser2.has_error ()) << "Expected the parse to fail";
        EXPECT_EQ (parser2.last_error (),
                   make_error_code (pstore::exchange::import_ns::error::unexpected_boolean));
    }
}